

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossibleArgument(TokenKind kind)

{
  short in_DI;
  bool local_1;
  
  if ((((((((ushort)(in_DI - 0x18U) < 2) || (in_DI == 0x5d)) || (in_DI == 0x5f)) ||
        ((in_DI == 0x73 || (in_DI == 0x8c)))) ||
       ((in_DI == 0xa3 || ((in_DI == 0xa9 || (in_DI == 0xb6)))))) || (in_DI == 0xdb)) ||
     ((((in_DI == 0xde || (in_DI == 0xe2)) || (in_DI == 0xec)) ||
      (((in_DI == 0x102 || ((ushort)(in_DI - 0x10cU) < 3)) ||
       ((in_DI == 0x11e || (((ushort)(in_DI - 0x125U) < 2 || (in_DI == 0x14a)))))))))) {
    local_1 = true;
  }
  else {
    local_1 = isPossibleExpression(kind);
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isPossibleArgument(TokenKind kind) {
    // allow a comma here to handle cases like:  foo(, 3);
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::Comma:
        case TokenKind::FirstMatchKeyword:
        case TokenKind::StrongKeyword:
        case TokenKind::WeakKeyword:
        case TokenKind::NotKeyword:
        case TokenKind::IfKeyword:
        case TokenKind::CaseKeyword:
        case TokenKind::NextTimeKeyword:
        case TokenKind::SNextTimeKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::SAlwaysKeyword:
        case TokenKind::EventuallyKeyword:
        case TokenKind::SEventuallyKeyword:
        case TokenKind::AcceptOnKeyword:
        case TokenKind::SyncAcceptOnKeyword:
        case TokenKind::RejectOnKeyword:
        case TokenKind::SyncRejectOnKeyword:
        case TokenKind::EdgeKeyword:
        case TokenKind::PosEdgeKeyword:
        case TokenKind::NegEdgeKeyword:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}